

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_server_main.cpp
# Opt level: O2

void __thiscall settings::~settings(settings *this)

{
  std::__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->sessions).
              super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
            );
  booster::intrusive_ptr<cppcms::impl::base_cache>::operator=(&this->cache,(base_cache *)0x0);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&this->cache);
  booster::shared_object::~shared_object(&this->plugin);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->sessions).
              super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  cppcms::json::value::copyable::~copyable(&(this->config).d);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~settings()
	{
		sessions.reset(); // ensure that sessions object is destroyed before shared object
		cache = 0;
	}